

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<std::optional<int>const&>::operator<=
          (result *__return_storage_ptr__,expression_lhs<std::optional<int>const&> *this,int *rhs)

{
  lest lVar1;
  int iVar2;
  lest *this_00;
  int *in_R8;
  allocator<char> local_75;
  int local_74;
  string local_70;
  string local_50 [32];
  
  this_00 = *(lest **)this;
  lVar1 = this_00[4];
  local_74 = *(int *)this_00;
  iVar2 = *rhs;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"<=",&local_75);
  to_string<std::optional<int>,int>(&local_70,this_00,(optional<int> *)local_50,(string *)rhs,in_R8)
  ;
  __return_storage_ptr__->passed = (bool)(local_74 <= iVar2 | (byte)lVar1 ^ 1);
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_70)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }